

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u64 sqlite3Fts5IndexEntryCksum(i64 iRowid,int iCol,int iPos,int iIdx,char *pTerm,int nTerm)

{
  long lVar1;
  u64 uVar2;
  ulong uVar3;
  ulong uVar4;
  u64 ret;
  
  lVar1 = (long)iPos + (iRowid * 9 + (long)iCol) * 9;
  uVar4 = 0;
  uVar3 = (ulong)(uint)iIdx + lVar1 * 8 + 0x30;
  if (iIdx < 0) {
    uVar3 = uVar4;
  }
  uVar2 = uVar3 + lVar1;
  uVar3 = 0;
  if (0 < nTerm) {
    uVar3 = (ulong)(uint)nTerm;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    uVar2 = uVar2 * 9 + (long)pTerm[uVar4];
  }
  return uVar2;
}

Assistant:

static u64 sqlite3Fts5IndexEntryCksum(
  i64 iRowid, 
  int iCol, 
  int iPos, 
  int iIdx,
  const char *pTerm,
  int nTerm
){
  int i;
  u64 ret = iRowid;
  ret += (ret<<3) + iCol;
  ret += (ret<<3) + iPos;
  if( iIdx>=0 ) ret += (ret<<3) + (FTS5_MAIN_PREFIX + iIdx);
  for(i=0; i<nTerm; i++) ret += (ret<<3) + pTerm[i];
  return ret;
}